

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void Curl_doh_cleanup(Curl_easy *data)

{
  doh_probes *pdVar1;
  int local_1c;
  int i;
  doh_probes *dohp;
  Curl_easy *data_local;
  
  pdVar1 = (data->state).async.doh;
  if (pdVar1 != (doh_probes *)0x0) {
    Curl_doh_close(data);
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      Curl_dyn_free(&pdVar1->probe_resp[local_1c].body);
    }
    (*Curl_cfree)((data->state).async.doh);
    (data->state).async.doh = (doh_probes *)0x0;
  }
  return;
}

Assistant:

void Curl_doh_cleanup(struct Curl_easy *data)
{
  struct doh_probes *dohp = data->state.async.doh;
  if(dohp) {
    int i;
    Curl_doh_close(data);
    for(i = 0; i < DOH_SLOT_COUNT; ++i) {
      Curl_dyn_free(&dohp->probe_resp[i].body);
    }
    Curl_safefree(data->state.async.doh);
  }
}